

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O2

void Gia_ManDualXorN(Gia_Man_t *p,int *pLits,int n,int *LitZ)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  LitZ[0] = 0;
  LitZ[1] = 0;
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = Gia_ManHashXor(p,*LitZ,pLits[uVar2 * 2]);
    *LitZ = iVar1;
    iVar1 = Gia_ManHashOr(p,LitZ[1],pLits[uVar2 * 2 + 1]);
    LitZ[1] = iVar1;
  }
  return;
}

Assistant:

void Gia_ManDualXorN( Gia_Man_t * p, int * pLits, int n, int LitZ[2] )
{
    int i;
    LitZ[0] = 0;
    LitZ[1] = 0;
    for ( i = 0; i < n; i++ )
    {
        LitZ[0] = Gia_ManHashXor( p, LitZ[0], pLits[2*i] );
        LitZ[1] = Gia_ManHashOr ( p, LitZ[1], pLits[2*i+1] );
    }
}